

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::
BlockIterator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>const,32,std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>const*const*>
::checkEquivalence<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>**>
          (BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
           *this,unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **testv,
          int testoffset)

{
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar1;
  
  ppuVar1 = this->vec;
  if ((ppuVar1 != testv) &&
     ((((testv == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0 ||
        (ppuVar1 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0)) ||
       (*testv != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)0x0)) ||
      (*ppuVar1 != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)0x0)))) {
    return false;
  }
  return this->offset == testoffset;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }